

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

void getcolormap(nn_quant *nnq,uchar *map)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  
  if (0 < nnq->netsize) {
    piVar1 = nnq->network[0] + 3;
    lVar2 = 0;
    do {
      lVar3 = 0;
      do {
        *map = (uchar)piVar1[lVar3];
        map = map + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != -4);
      lVar2 = lVar2 + 1;
      piVar1 = piVar1 + 5;
    } while (lVar2 < nnq->netsize);
  }
  return;
}

Assistant:

void getcolormap(nnq, map)
nn_quant *nnq;
unsigned char *map;
{
	int i,j;
	for(j=0; j < nnq->netsize; j++) {
		for (i=3; i>=0; i--) {
			*map = nnq->network[j][i];
			map++;
		}
	}
}